

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::AsyncIoStream,_std::nullptr_t> __thiscall
kj::HttpServer::Connection::getConnectStream(Connection *this)

{
  Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *this_00;
  SourceLocation location;
  AsyncIoStreamWithGuards *this_01;
  AsyncIoStream *extraout_RDX;
  long in_RSI;
  Own<kj::AsyncIoStream,_std::nullptr_t> OVar1;
  Own<kj::AsyncIoStream,_std::nullptr_t> ownStream;
  DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
  _kjCondition;
  PromiseFulfillerPair<void> paf;
  Fault f;
  ReleasedBuffer releasedBuffer;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_158;
  char local_150;
  long local_148;
  PromiseBase local_140;
  Disposer *local_138;
  AsyncIoStreamWithInitialBuffer *in_stack_fffffffffffffed0;
  Disposer *in_stack_fffffffffffffed8;
  AsyncIoStream *in_stack_fffffffffffffee0;
  undefined1 local_118 [48];
  Own<kj::AsyncIoStream,_std::nullptr_t> local_e8;
  Own<kj::AsyncIoStreamWithInitialBuffer,_std::nullptr_t> local_d0;
  char *local_c0;
  char *pcStack_b8;
  undefined8 local_b0;
  PromiseFulfillerPair<void> local_a8;
  Own<kj::AsyncIoStreamWithGuards,_std::nullptr_t> local_90;
  Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> local_80;
  ReleasedBuffer local_50;
  
  this_00 = (Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)(in_RSI + 0x188);
  local_118[0x20] = *(long *)(in_RSI + 400) == 0;
  local_118._8_8_ = &kj::none;
  local_118._16_8_ = " == ";
  local_118._24_8_ = &DAT_00000005;
  local_118._0_8_ = this_00;
  if ((bool)local_118[0x20]) {
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
    ;
    pcStack_b8 = "getConnectStream";
    local_b0 = 0x1000001f8a;
    location.function = (char *)in_stack_fffffffffffffed8;
    location.fileName = (char *)in_stack_fffffffffffffed0;
    location._16_8_ = in_stack_fffffffffffffee0;
    newPromiseAndFulfiller<void>(location);
    local_118._0_8_ = local_a8.fulfiller.disposer;
    local_118._8_8_ = local_a8.fulfiller.ptr;
    local_a8.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::operator=
              (this_00,(Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)local_118);
    Own<kj::PromiseFulfiller<void>,_std::nullptr_t>::dispose
              ((Own<kj::PromiseFulfiller<void>,_std::nullptr_t> *)local_118);
    anon_unknown_36::HttpInputStreamImpl::releaseBuffer
              (&local_50,(HttpInputStreamImpl *)(in_RSI + 0x38));
    local_150 = '\x01';
    local_148 = in_RSI;
    heap<kj::AsyncIoStreamWithInitialBuffer,kj::Own<kj::AsyncIoStream,decltype(nullptr)>,kj::Array<unsigned_char>,kj::ArrayPtr<unsigned_char>&>
              ((kj *)&local_d0,(Own<kj::AsyncIoStream,_std::nullptr_t> *)&stack0xfffffffffffffed8,
               &local_50.buffer,&local_50.leftover);
    Own<kj::AsyncIoStreamWithInitialBuffer,decltype(nullptr)>::
    attach<kj::_::Deferred<kj::HttpServer::Connection::getConnectStream()::_lambda()_1_>>
              ((Own<kj::AsyncIoStreamWithInitialBuffer,decltype(nullptr)> *)&local_138,
               (Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_http_c__:8079:38)>
                *)&local_d0);
    local_80.ptr.isSet = false;
    this_01 = (AsyncIoStreamWithGuards *)operator_new(0x88);
    local_e8.disposer = local_138;
    Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::Maybe
              ((Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)local_118,
               &local_80);
    Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>::Promise
              ((Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
                *)&local_158,
               (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)local_118);
    local_140.node.ptr = (OwnPromiseNode)(OwnPromiseNode)local_a8.promise.super_PromiseBase.node.ptr
    ;
    local_a8.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    AsyncIoStreamWithGuards::AsyncIoStreamWithGuards
              (this_01,&local_e8,
               (Promise<kj::Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>_>
                *)&local_158,(Promise<void> *)&local_140);
    local_90.disposer = (Disposer *)&kj::_::HeapDisposer<kj::AsyncIoStreamWithGuards>::instance;
    local_90.ptr = this_01;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_140.node);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_158);
    Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::~Maybe
              ((Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer> *)local_118);
    Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_e8);
    (this->super_Response)._vptr_Response =
         (_func_int **)&kj::_::HeapDisposer<kj::AsyncIoStreamWithGuards>::instance;
    (this->super_ConnectResponse)._vptr_ConnectResponse = (_func_int **)this_01;
    local_90.ptr = (AsyncIoStreamWithGuards *)0x0;
    Own<kj::AsyncIoStreamWithGuards,_std::nullptr_t>::dispose(&local_90);
    Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl::ReleasedBuffer>::~Maybe(&local_80);
    Own<kj::AsyncIoStreamWithInitialBuffer,_std::nullptr_t>::dispose
              ((Own<kj::AsyncIoStreamWithInitialBuffer,_std::nullptr_t> *)&local_138);
    Own<kj::AsyncIoStreamWithInitialBuffer,_std::nullptr_t>::dispose(&local_d0);
    if (local_150 == '\x01') {
      *(undefined1 *)(local_148 + 0x163) = 1;
    }
    Array<unsigned_char>::~Array(&local_50.buffer);
    Own<kj::AsyncIoStream,_std::nullptr_t>::dispose
              ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&stack0xfffffffffffffed8);
    PromiseFulfillerPair<void>::~PromiseFulfillerPair(&local_a8);
    OVar1.ptr = extraout_RDX;
    OVar1.disposer = (Disposer *)this;
    return OVar1;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,decltype(nullptr)>>&,kj::None_const&>&,char_const(&)[40]>
            ((Fault *)&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x1f89,FAILED,"tunnelWriteGuard == kj::none",
             "_kjCondition,\"the tunnel stream was already retrieved\"",
             (DebugComparison<kj::Maybe<kj::Own<kj::PromiseFulfiller<void>,_std::nullptr_t>_>_&,_const_kj::None_&>
              *)local_118,(char (*) [40])"the tunnel stream was already retrieved");
  kj::_::Debug::Fault::fatal((Fault *)&local_80);
}

Assistant:

kj::Own<kj::AsyncIoStream> getConnectStream() {
    // Returns an AsyncIoStream over the internal stream but that waits for a Promise to be
    // resolved to allow writes after either accept or reject are called. Reads are allowed
    // immediately.
    KJ_REQUIRE(tunnelWriteGuard == kj::none, "the tunnel stream was already retrieved");
    auto paf = kj::newPromiseAndFulfiller<void>();
    tunnelWriteGuard = kj::mv(paf.fulfiller);

    kj::Own<kj::AsyncIoStream> ownStream(&stream, kj::NullDisposer::instance);
    auto releasedBuffer = httpInput.releaseBuffer();
    auto deferNoteClosed = kj::defer([this]() { webSocketOrConnectClosed = true; });
    return kj::heap<AsyncIoStreamWithGuards>(
        kj::heap<AsyncIoStreamWithInitialBuffer>(
            kj::mv(ownStream),
            kj::mv(releasedBuffer.buffer),
            releasedBuffer.leftover).attach(kj::mv(deferNoteClosed)),
        kj::Maybe<HttpInputStreamImpl::ReleasedBuffer>(kj::none),
        kj::mv(paf.promise));
  }